

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::set_version_flag(App *this,string *flag_name,string *versionString,string *version_help)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Option *pOVar3;
  string local_a8;
  anon_class_32_1_1f2bc529 local_88;
  string local_68;
  _Any_data local_48;
  code *local_38;
  
  if (this->version_ptr_ != (Option *)0x0) {
    remove_option(this,this->version_ptr_);
    this->version_ptr_ = (Option *)0x0;
  }
  if (flag_name->_M_string_length != 0) {
    pcVar2 = (flag_name->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + flag_name->_M_string_length);
    paVar1 = &local_88.versionString.field_2;
    pcVar2 = (versionString->_M_dataplus)._M_p;
    local_88.versionString._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + versionString->_M_string_length);
    ::std::function<void()>::
    function<CLI::App::set_version_flag(std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,void>
              ((function<void()> *)local_48._M_pod_data,&local_88);
    pcVar2 = (version_help->_M_dataplus)._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + version_help->_M_string_length);
    pOVar3 = add_flag_callback(this,&local_68,(function<void_()> *)&local_48,&local_a8);
    this->version_ptr_ = pOVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.versionString._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.versionString._M_dataplus._M_p,
                      local_88.versionString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    (this->version_ptr_->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return this->version_ptr_;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, const std::string &versionString, const std::string &version_help) {
    // take flag_description by const reference otherwise add_flag tries to assign to version_description
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ = add_flag_callback(
            flag_name, [versionString]() { throw(CLI::CallForVersion(versionString, 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}